

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O0

cio_error cio_buffered_stream_write
                    (cio_buffered_stream *buffered_stream,cio_write_buffer *buffer,
                    cio_buffered_stream_write_handler_t handler,void *handler_context)

{
  bool bVar1;
  void *handler_context_local;
  cio_buffered_stream_write_handler_t handler_local;
  cio_write_buffer *buffer_local;
  cio_buffered_stream *buffered_stream_local;
  
  bVar1 = true;
  if ((buffered_stream != (cio_buffered_stream *)0x0) &&
     (bVar1 = true, buffer != (cio_write_buffer *)0x0)) {
    bVar1 = handler == (cio_buffered_stream_write_handler_t)0x0;
  }
  if (bVar1) {
    buffered_stream_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    buffered_stream->write_handler = handler;
    buffered_stream->write_handler_context = handler_context;
    buffered_stream_local._4_4_ =
         (*buffered_stream->stream->write_some)
                   (buffered_stream->stream,buffer,handle_first_write,buffered_stream);
  }
  return buffered_stream_local._4_4_;
}

Assistant:

enum cio_error cio_buffered_stream_write(struct cio_buffered_stream *buffered_stream, struct cio_write_buffer *buffer, cio_buffered_stream_write_handler_t handler, void *handler_context)
{
	if (cio_unlikely((buffered_stream == NULL) || (buffer == NULL) || (handler == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	buffered_stream->write_handler = handler;
	buffered_stream->write_handler_context = handler_context;

	return buffered_stream->stream->write_some(buffered_stream->stream, buffer, handle_first_write, buffered_stream);
}